

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O2

void __thiscall
dgMatrix::TransformTriplex
          (dgMatrix *this,HaF64 *dst,HaI32 dstStrideInBytes,HaF64 *src,HaI32 srcStrideInBytes,
          HaI32 count)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar7;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  HaF64 *pHVar16;
  double *pdVar17;
  uint uVar18;
  bool bVar19;
  undefined8 in_XMM4_Qa;
  undefined1 auVar20 [16];
  undefined8 in_XMM6_Qa;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  uVar3 = (this->m_front).super_dgTemplateVector<float>.m_x;
  uVar8 = (this->m_front).super_dgTemplateVector<float>.m_y;
  auVar12._4_4_ = uVar8;
  auVar12._0_4_ = uVar3;
  auVar12._8_8_ = 0;
  auVar12 = vcvtps2pd_avx(auVar12);
  uVar4 = (this->m_up).super_dgTemplateVector<float>.m_x;
  uVar9 = (this->m_up).super_dgTemplateVector<float>.m_y;
  auVar13._4_4_ = uVar9;
  auVar13._0_4_ = uVar4;
  auVar13._8_8_ = 0;
  auVar13 = vcvtps2pd_avx(auVar13);
  uVar5 = (this->m_right).super_dgTemplateVector<float>.m_x;
  uVar10 = (this->m_right).super_dgTemplateVector<float>.m_y;
  auVar14._4_4_ = uVar10;
  auVar14._0_4_ = uVar5;
  auVar14._8_8_ = 0;
  auVar14 = vcvtps2pd_avx(auVar14);
  uVar6 = (this->m_posit).super_dgTemplateVector<float>.m_x;
  uVar11 = (this->m_posit).super_dgTemplateVector<float>.m_y;
  auVar15._4_4_ = uVar11;
  auVar15._0_4_ = uVar6;
  auVar15._8_8_ = 0;
  auVar15 = vcvtps2pd_avx(auVar15);
  pdVar17 = (double *)(dst + 2);
  pHVar16 = src + 2;
  auVar20._0_8_ = (double)(this->m_front).super_dgTemplateVector<float>.m_z;
  auVar20._8_8_ = in_XMM4_Qa;
  fVar1 = (this->m_up).super_dgTemplateVector<float>.m_z;
  auVar21._0_8_ = (double)(this->m_right).super_dgTemplateVector<float>.m_z;
  auVar21._8_8_ = in_XMM6_Qa;
  fVar2 = (this->m_posit).super_dgTemplateVector<float>.m_z;
  uVar18 = ~(count >> 0x1f) & count;
  while (bVar19 = uVar18 != 0, uVar18 = uVar18 - 1, bVar19) {
    dVar7 = (double)pHVar16[-1];
    auVar24._8_8_ = pHVar16[-2];
    auVar24._0_8_ = pHVar16[-2];
    auVar25._8_8_ = *pHVar16;
    auVar25._0_8_ = *pHVar16;
    pHVar16 = pHVar16 + (srcStrideInBytes >> 3);
    auVar23._0_8_ = dVar7 * auVar13._0_8_;
    auVar23._8_8_ = dVar7 * auVar13._8_8_;
    auVar23 = vfmadd231pd_fma(auVar23,auVar24,auVar12);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar7 * (double)fVar1;
    auVar22 = vfmadd231sd_fma(auVar22,auVar20,auVar24);
    auVar23 = vfmadd231pd_fma(auVar23,auVar25,auVar14);
    auVar22 = vfmadd231sd_fma(auVar22,auVar21,auVar25);
    pdVar17[-2] = auVar23._0_8_ + auVar15._0_8_;
    pdVar17[-1] = auVar23._8_8_ + auVar15._8_8_;
    *pdVar17 = auVar22._0_8_ + (double)fVar2;
    pdVar17 = pdVar17 + (dstStrideInBytes >> 3);
  }
  return;
}

Assistant:

void dgMatrix::TransformTriplex (hacd::HaF64* const dst, hacd::HaI32 dstStrideInBytes, const hacd::HaF64* const src, hacd::HaI32 srcStrideInBytes, hacd::HaI32 count) const
{
	hacd::HaI32 dstStride = dstStrideInBytes /sizeof (hacd::HaF64);
	hacd::HaI32 srcStride = srcStrideInBytes / sizeof (hacd::HaF64);

	hacd::HaI32 dstIndex = 0;
	hacd::HaI32 srcIndex = 0;
	for (hacd::HaI32 i = 0 ; i < count; i ++ ) {
		hacd::HaF64 x = src[srcIndex + 0];
		hacd::HaF64 y = src[srcIndex + 1];
		hacd::HaF64 z = src[srcIndex + 2];
		srcIndex += srcStride;
		dst[dstIndex + 0] = x * m_front.m_x + y * m_up.m_x + z * m_right.m_x + m_posit.m_x;
		dst[dstIndex + 1] = x * m_front.m_y + y * m_up.m_y + z * m_right.m_y + m_posit.m_y;
		dst[dstIndex + 2] = x * m_front.m_z + y * m_up.m_z + z * m_right.m_z + m_posit.m_z;
		dstIndex += dstStride;
	}
}